

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Runtime *this;
  Bracket *this_00;
  undefined4 extraout_var;
  unsigned_long pos;
  string str;
  list<Bracket_*,_std::allocator<Bracket_*>_> brackets;
  ifstream t;
  undefined8 auStack_148 [36];
  
  if (argc == 1) {
    Code::FinalShell();
  }
  else {
    this = (Runtime *)operator_new(8);
    Runtime::Runtime(this);
    std::ifstream::ifstream(&t,argv[1],_S_in);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&str,*(undefined8 *)((long)auStack_148 + *(long *)(_t + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    pos = 0;
    brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&brackets;
    brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node._M_size = 0;
    brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>._M_impl._M_node.
         super__List_node_base._M_next;
    while (pos < str._M_string_length) {
      if (str._M_dataplus._M_p[pos] == '(') {
        this_00 = (Bracket *)operator_new(0x40);
        Bracket::Bracket(this_00,&str,&pos);
        iVar1 = (*(this_00->super_Atom)._vptr_Atom[3])(this_00,this);
        Data::check((Data *)CONCAT44(extraout_var,iVar1));
      }
      else {
        pos = pos + 1;
      }
    }
    Runtime::~Runtime(this);
    operator_delete(this);
    std::__cxx11::_List_base<Bracket_*,_std::allocator<Bracket_*>_>::_M_clear
              (&brackets.super__List_base<Bracket_*,_std::allocator<Bracket_*>_>);
    std::__cxx11::string::~string((string *)&str);
    std::ifstream::~ifstream(&t);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc == 1) {
        Code::FinalShell();
    } else {
        auto runtime = new Runtime();
        std::ifstream t(argv[1]);
        std::string str((std::istreambuf_iterator<char>(t)), std::istreambuf_iterator<char>());
        unsigned long pos = 0;
        std::list<Bracket *> brackets;
        Bracket* temp;
        while (pos < str.length()) {
            if (str[pos] != '(') {
                pos++;
            } else {
                temp = new Bracket(str, pos);
                Data::check(temp->eval(runtime));
            }
        }
        delete runtime;
    }

    return 0;
}